

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_set.c
# Opt level: O0

int mpt_string_set(char **ptr,char *data,int len)

{
  size_t sVar1;
  char *__dest;
  char *txt;
  int len_local;
  char *data_local;
  char **ptr_local;
  
  if (data == (char *)0x0) {
    txt._4_4_ = 0;
  }
  else {
    txt._4_4_ = len;
    if (len < 0) {
      sVar1 = strlen(data);
      txt._4_4_ = (int)sVar1;
    }
  }
  if (txt._4_4_ == 0) {
    free(*ptr);
    *ptr = (char *)0x0;
    ptr_local._4_4_ = 0;
  }
  else if (data == *ptr) {
    ptr_local._4_4_ = 0;
  }
  else {
    __dest = (char *)realloc(*ptr,(long)(txt._4_4_ + 1));
    if (__dest == (char *)0x0) {
      ptr_local._4_4_ = -4;
    }
    else {
      memcpy(__dest,data,(long)txt._4_4_);
      *ptr = __dest;
      __dest[txt._4_4_] = '\0';
      ptr_local._4_4_ = txt._4_4_;
    }
  }
  return ptr_local._4_4_;
}

Assistant:

extern int mpt_string_set(char **ptr, const char *data, int len)
{
	char *txt;
	
	if (!data) {
		len = 0;
	}
	else if (len < 0) {
		len = strlen(data);
	}
	if (!len) {
		free(*ptr);
		*ptr = 0;
		return 0;
	}
	if (data == *ptr) {
		return 0;
	}
	if (!(txt = realloc(*ptr, len + 1))) {
		return MPT_ERROR(BadOperation);
	}
	*ptr = memcpy(txt, data, len);
	txt[len] = 0;
	
	return len;
}